

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

bool __thiscall
ON_DimStyle::Internal_SetStringMember
          (ON_DimStyle *this,field field_id,wchar_t *value,ON_wString *class_member)

{
  undefined8 uVar1;
  bool bVar2;
  wchar_t *other_string;
  
  bVar2 = ON_wString::IsValid(class_member,true);
  other_string = L"";
  if (bVar2) {
    other_string = value;
  }
  bVar2 = ON_wString::EqualOrdinal(class_member,other_string,false);
  if (!bVar2) {
    ON_wString::operator=(class_member,other_string);
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return !bVar2;
}

Assistant:

bool ON_DimStyle::Internal_SetStringMember(
  ON_DimStyle::field field_id,
  const wchar_t* value,
  ON_wString& class_member
)
{
  if (false == class_member.IsValid(true))
  {
    // just in case value pointed to the bogus string array.
    value = L"";
  }
  bool bValueChanged = false;
  if (false == class_member.EqualOrdinal(value,false) )
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}